

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_mstring_copy_mbs(archive_mstring *aes,char *mbs)

{
  size_t len;
  
  if (mbs == (char *)0x0) {
    aes->aes_set = L'\0';
  }
  else {
    len = strlen(mbs);
    archive_mstring_copy_mbs_len(aes,mbs,len);
  }
  return L'\0';
}

Assistant:

int
archive_mstring_copy_mbs(struct archive_mstring *aes, const char *mbs)
{
	if (mbs == NULL) {
		aes->aes_set = 0;
		return (0);
	}
	return (archive_mstring_copy_mbs_len(aes, mbs, strlen(mbs)));
}